

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O3

LY_ERR lyd_new_ext_inner(lysc_ext_instance *ext,char *name,lyd_node **node)

{
  LY_ERR LVar1;
  lysc_node *schema;
  char *format;
  ly_ctx *ctx;
  char *pcVar2;
  lyd_node *ret;
  lyd_node *local_30;
  
  local_30 = (lyd_node *)0x0;
  if (ext == (lysc_ext_instance *)0x0) {
    pcVar2 = "ext";
    ctx = (ly_ctx *)0x0;
  }
  else {
    ctx = ext->module->ctx;
    if (node == (lyd_node **)0x0) {
      pcVar2 = "node";
    }
    else {
      if (name != (char *)0x0) {
        schema = lysc_ext_find_node(ext,(lys_module *)0x0,name,0,0x701,0);
        if (schema == (lysc_node *)0x0) {
          pcVar2 = ext->def->name;
          if (ext->argument == (char *)0x0) {
            format = "Inner node (not a list)  \"%s\" not found in instance of extension %s.";
          }
          else {
            format = "Inner node (not a list) \"%s\" not found in instance \"%s\" of extension %s.";
            pcVar2 = ext->argument;
          }
          ly_log(ctx,LY_LLERR,LY_EINVAL,format,name,pcVar2);
          return LY_ENOTFOUND;
        }
        LVar1 = lyd_create_inner(schema,&local_30);
        if (LVar1 != LY_SUCCESS) {
          return LY_EMEM;
        }
        *node = local_30;
        return LY_SUCCESS;
      }
      pcVar2 = "name";
    }
  }
  ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar2,"lyd_new_ext_inner");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_new_ext_inner(const struct lysc_ext_instance *ext, const char *name, struct lyd_node **node)
{
    struct lyd_node *ret = NULL;
    const struct lysc_node *schema;
    struct ly_ctx *ctx = ext ? ext->module->ctx : NULL;

    LY_CHECK_ARG_RET(ctx, ext, node, name, LY_EINVAL);

    schema = lysc_ext_find_node(ext, NULL, name, 0, LYS_CONTAINER | LYS_NOTIF | LYS_RPC | LYS_ACTION, 0);
    if (!schema) {
        if (ext->argument) {
            LOGERR(ctx, LY_EINVAL, "Inner node (not a list) \"%s\" not found in instance \"%s\" of extension %s.",
                    name, ext->argument, ext->def->name);
        } else {
            LOGERR(ctx, LY_EINVAL, "Inner node (not a list)  \"%s\" not found in instance of extension %s.",
                    name, ext->def->name);
        }
        return LY_ENOTFOUND;
    }
    LY_CHECK_RET(lyd_create_inner(schema, &ret));

    *node = ret;

    return LY_SUCCESS;
}